

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

WebSocketResponse *
kj::_::convertToReturn<kj::HttpClient::WebSocketResponse>
          (WebSocketResponse *__return_storage_ptr__,
          ExceptionOr<kj::HttpClient::WebSocketResponse> *result)

{
  WebSocketResponse *pWVar1;
  Exception *pEVar2;
  Exception *exception_1;
  Exception *_exception92;
  Exception *exception;
  Exception *_exception88;
  WebSocketResponse *value;
  WebSocketResponse *_value87;
  ExceptionOr<kj::HttpClient::WebSocketResponse> *result_local;
  
  pWVar1 = readMaybe<kj::HttpClient::WebSocketResponse>(&result->value);
  if (pWVar1 != (WebSocketResponse *)0x0) {
    pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)result);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    pWVar1 = mv<kj::HttpClient::WebSocketResponse>(pWVar1);
    pWVar1 = returnMaybeVoid<kj::HttpClient::WebSocketResponse>(pWVar1);
    HttpClient::WebSocketResponse::WebSocketResponse(__return_storage_ptr__,pWVar1);
    return __return_storage_ptr__;
  }
  pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)result);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  unreachable();
}

Assistant:

inline T convertToReturn(ExceptionOr<T>&& result) {
  KJ_IF_SOME(value, result.value) {
    KJ_IF_SOME(exception, result.exception) {
      throwRecoverableException(kj::mv(exception));
    }
    return _::returnMaybeVoid(kj::mv(value));
  } else KJ_IF_SOME(exception, result.exception) {
    throwFatalException(kj::mv(exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }